

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O0

void TTD::NSLogEvents::HasPropertyAction_Execute
               (EventLogEntry *evt,ThreadContextTTD *executeContext)

{
  BOOL BVar1;
  PropertyId propertyId;
  ScriptContext *scriptContext;
  JsRTVarAndIntegralArgumentsAction_InternalUse<1UL,_1UL> *argAction;
  TTDVar origVar;
  RecyclableObject *this;
  ScriptContext *pSVar2;
  RecyclableObject *__obj;
  Var var;
  JsRTSingleVarScalarArgumentAction *action;
  ScriptContext *ctx;
  ThreadContextTTD *executeContext_local;
  EventLogEntry *evt_local;
  
  scriptContext = ThreadContextTTD::GetActiveScriptContext(executeContext);
  if (scriptContext != (ScriptContext *)0x0) {
    argAction = GetInlineEventDataAs<TTD::NSLogEvents::JsRTVarAndIntegralArgumentsAction_InternalUse<1ul,1ul>,(TTD::NSLogEvents::EventKind)45>
                          (evt);
    origVar = GetVarItem_0<1ul,1ul>(argAction);
    __obj = (RecyclableObject *)InflateVarInReplay(executeContext,origVar);
    if ((__obj != (RecyclableObject *)0x0) &&
       (BVar1 = Js::JavascriptOperators::IsObject(__obj), BVar1 != 0)) {
      this = Js::VarTo<Js::RecyclableObject>(__obj);
      pSVar2 = Js::RecyclableObject::GetScriptContext(this);
      if (pSVar2 != scriptContext) {
        __obj = (RecyclableObject *)Js::CrossSite::MarshalVar(scriptContext,this,false);
      }
      propertyId = GetPropertyIdItem<1ul,1ul>(argAction);
      Js::JavascriptOperators::OP_HasProperty(__obj,propertyId,scriptContext);
    }
    return;
  }
  TTDAbort_unrecoverable_error("This should be non-null!!!");
}

Assistant:

void HasPropertyAction_Execute(const EventLogEntry* evt, ThreadContextTTD* executeContext)
        {
            TTD_REPLAY_ACTIVE_CONTEXT(executeContext);
            const JsRTSingleVarScalarArgumentAction* action = GetInlineEventDataAs<JsRTSingleVarScalarArgumentAction, EventKind::HasPropertyActionTag>(evt);
            Js::Var var = InflateVarInReplay(executeContext, GetVarItem_0(action));
            TTD_REPLAY_VALIDATE_INCOMING_OBJECT(var, ctx);

            //Result is not needed but trigger computation for any effects
            Js::JavascriptOperators::OP_HasProperty(var, GetPropertyIdItem(action), ctx);
        }